

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecChoice.c
# Opt level: O3

void Cec_ManCombSpecReduce_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  ulong uVar3;
  
  if (pObj->Value != 0xffffffff) {
    return;
  }
  pGVar1 = p->pObjs;
  if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar3 = (ulong)(uint)p->pReprs[(int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555] &
          0xfffffff;
  if (uVar3 != 0xfffffff) {
    if (p->nObjs <= (int)uVar3) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if (pGVar1 != (Gia_Obj_t *)0x0) {
      pGVar1 = pGVar1 + uVar3;
      Cec_ManCombSpecReduce_rec(pNew,p,pGVar1);
      if ((int)pGVar1->Value < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf5,"int Abc_LitNotCond(int, int)");
      }
      uVar2 = pGVar1->Value ^
              ((uint)((ulong)*(undefined8 *)pGVar1 >> 0x20) ^
              (uint)((ulong)*(undefined8 *)pObj >> 0x20)) >> 0x1f;
      goto LAB_005ca17b;
    }
  }
  uVar2 = Cec_ManCombSpecReal(pNew,p,pObj);
LAB_005ca17b:
  pObj->Value = uVar2;
  return;
}

Assistant:

void Cec_ManCombSpecReduce_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pRepr;
    if ( ~pObj->Value )
        return;
    if ( (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
    {
        Cec_ManCombSpecReduce_rec( pNew, p, pRepr );
        pObj->Value = Abc_LitNotCond( pRepr->Value, Gia_ObjPhase(pRepr) ^ Gia_ObjPhase(pObj) );
        return;
    }
    pObj->Value = Cec_ManCombSpecReal( pNew, p, pObj );
}